

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint uVar4;
  ImU32 IVar5;
  GetterXsYs<unsigned_int> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pIVar15 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  lVar17 = (long)(((pGVar6->Offset + prim + 1) % iVar16 + iVar16) % iVar16) * (long)pGVar6->Stride;
  uVar4 = *(uint *)((long)pGVar6->Xs + lVar17);
  dVar12 = log10((double)*(uint *)((long)pGVar6->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar16 = pTVar7->YAxis;
  pIVar8 = pIVar15->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar16].Range.Min;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  fVar18 = (float)(pIVar15->Mx * ((double)uVar4 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x);
  fVar19 = (float)(pIVar15->My[iVar16] *
                   (((double)(float)(dVar12 / pIVar15->LogDenY[iVar16]) *
                     (pIVar8->YAxis[iVar16].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar20 = (this->P1).x;
  fVar21 = (this->P1).y;
  auVar25._0_4_ = ~-(uint)(fVar18 <= fVar20) & (uint)fVar18;
  auVar25._4_4_ = ~-(uint)(fVar19 <= fVar21) & (uint)fVar19;
  auVar25._8_4_ = ~-(uint)(fVar20 < fVar18) & (uint)fVar18;
  auVar25._12_4_ = ~-(uint)(fVar21 < fVar19) & (uint)fVar19;
  auVar13._4_4_ = (uint)fVar21 & -(uint)(fVar19 <= fVar21);
  auVar13._0_4_ = (uint)fVar20 & -(uint)(fVar18 <= fVar20);
  auVar13._8_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar18);
  auVar13._12_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar19);
  auVar25 = auVar25 | auVar13;
  fVar22 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar25._8_8_;
  auVar14._0_4_ = -(uint)(auVar25._4_4_ < fVar22);
  auVar26._0_8_ = auVar14._0_8_ << 0x20;
  auVar26._8_4_ = -(uint)(auVar25._8_4_ < (cull_rect->Max).x);
  auVar26._12_4_ = -(uint)(auVar25._12_4_ < (cull_rect->Max).y);
  auVar27._4_4_ = -(uint)(fVar22 < auVar25._4_4_);
  auVar27._0_4_ = -(uint)((cull_rect->Min).x < auVar25._0_4_);
  auVar27._8_8_ = auVar26._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar27);
  if (iVar16 == 0xf) {
    IVar5 = this->Col;
    IVar2 = *uv;
    fVar22 = fVar18 - fVar20;
    fVar23 = fVar19 - fVar21;
    fVar24 = fVar22 * fVar22 + fVar23 * fVar23;
    if (0.0 < fVar24) {
      fVar24 = 1.0 / SQRT(fVar24);
      fVar22 = fVar22 * fVar24;
      fVar23 = fVar23 * fVar24;
    }
    fVar24 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    fVar22 = fVar24 * fVar22;
    fVar24 = fVar24 * fVar23;
    (pIVar9->pos).x = fVar20 + fVar24;
    (pIVar9->pos).y = fVar21 - fVar22;
    pIVar10[1].pos.x = fVar24 + fVar18;
    pIVar10[1].pos.y = fVar19 - fVar22;
    pIVar10[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar5;
    pIVar9[2].pos.x = fVar18 - fVar24;
    pIVar9[2].pos.y = fVar22 + fVar19;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar5;
    IVar3 = this->P1;
    pIVar9[3].pos.x = IVar3.x - fVar24;
    pIVar9[3].pos.y = IVar3.y + fVar22;
    pIVar9[3].uv.x = IVar2.x;
    pIVar9[3].uv.y = IVar2.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar4;
    puVar11[1] = uVar4 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar4;
    puVar11[4] = uVar4 + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar2.y = fVar19;
  IVar2.x = fVar18;
  this->P1 = IVar2;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }